

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O2

bool Am_Object_And_Owners_Valid_And_Visible(Am_Object *obj)

{
  bool bVar1;
  Am_Value *this;
  Am_Object AStack_38;
  
  while( true ) {
    bVar1 = Am_Object::Valid(obj);
    if (!bVar1) {
      return false;
    }
    this = Am_Object::Get(obj,0x69,4);
    bVar1 = Am_Value::operator_cast_to_bool(this);
    if (!bVar1) {
      return false;
    }
    bVar1 = Am_Object::operator==(obj,&Am_Screen);
    if (bVar1) {
      return true;
    }
    Am_Object::Get_Prototype(&AStack_38);
    bVar1 = Am_Object::operator==(&AStack_38,&Am_Screen);
    Am_Object::~Am_Object(&AStack_38);
    if (bVar1) break;
    Am_Object::Get_Owner(&AStack_38,(Am_Slot_Flags)obj);
    Am_Object::operator=(obj,&AStack_38);
    Am_Object::~Am_Object(&AStack_38);
  }
  return true;
}

Assistant:

bool
Am_Object_And_Owners_Valid_And_Visible(Am_Object obj)
{
  while (true) {
    if (!obj.Valid())
      return false;
    if (!(bool)obj.Get(Am_VISIBLE, Am_NO_DEPENDENCY))
      return false;
    if (obj == Am_Screen || obj.Get_Prototype() == Am_Screen)
      return true;
    obj = obj.Get_Owner(Am_NO_DEPENDENCY);
  }
}